

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::uhugeint_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::BinaryUhugeIntOperator>>
               (uhugeint_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uhugeint_t input;
  uhugeint_t input_00;
  bool bVar1;
  undefined8 *puVar2;
  idx_t iVar3;
  SelectionVector *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  string_t sVar4;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  idx_t in_stack_ffffffffffffff68;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff70;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff78;
  uint64_t in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  ulong idx_00;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (idx_00 = 0; idx_00 < in_RDX; idx_00 = idx_00 + 1) {
      iVar3 = SelectionVector::get_index(in_RCX,idx_00);
      input_00.upper = idx_00;
      input_00.lower = iVar3;
      in_stack_ffffffffffffff78.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           GenericUnaryWrapper::
           Operation<duckdb::UnaryStringOperator<duckdb::BinaryUhugeIntOperator>,duckdb::uhugeint_t,duckdb::string_t>
                     (input_00,(ValidityMask *)in_stack_ffffffffffffff78.pointer.ptr,
                      in_stack_ffffffffffffff78._0_8_,*(void **)(in_RDI + iVar3 * 0x10 + 8));
      puVar2 = (undefined8 *)(in_RSI + idx_00 * 0x10);
      *puVar2 = in_stack_ffffffffffffff78._0_8_;
      puVar2[1] = in_stack_ffffffffffffff78.pointer.ptr;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar1) {
        input.upper = (uint64_t)in_stack_ffffffffffffff90;
        input.lower = in_stack_ffffffffffffff88;
        sVar4 = GenericUnaryWrapper::
                Operation<duckdb::UnaryStringOperator<duckdb::BinaryUhugeIntOperator>,duckdb::uhugeint_t,duckdb::string_t>
                          (input,(ValidityMask *)in_stack_ffffffffffffff78.pointer.ptr,
                           in_stack_ffffffffffffff78._0_8_,in_stack_ffffffffffffff70);
        puVar2 = (undefined8 *)(in_RSI + local_40 * 0x10);
        local_58 = sVar4.value._0_8_;
        *puVar2 = local_58;
        local_50 = sVar4.value._8_8_;
        puVar2[1] = local_50;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}